

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall module_overview_csv_actions::begin(module_overview_csv_actions *this)

{
  ostream *poVar1;
  
  if (s_csv_table_marker == '\0') {
    std::operator<<((ostream *)&std::cout,"[Overview]\n");
  }
  if (s_csv_table_header != '\0') {
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Module");
  poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"Dependencies");
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void begin()
    {
        if( s_csv_table_marker )
            std::cout << "[Overview]\n";
        if( s_csv_table_header )
            std::cout << "Module" << s_csv_separator << "Dependencies" << "\n";
    }